

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O2

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,uint8_t *data,ValueLength length,int valuesPerLine,string *separator,
          string *header)

{
  this->data = data;
  this->length = length;
  this->valuesPerLine = valuesPerLine;
  std::__cxx11::string::string((string *)&this->separator,separator);
  std::__cxx11::string::string((string *)&this->header,header);
  return;
}

Assistant:

HexDump(uint8_t const* data, ValueLength length, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(data),
        length(length),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}